

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::PositionCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  char *__s2;
  size_t __n;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  undefined4 extraout_var_01;
  Output *pOVar6;
  char *local_c8;
  Output local_50;
  char *local_48;
  char *move;
  char *position;
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  if (((params == (char *)0x0) || (*params == '\0')) ||
     (bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18), bVar1)) {
    Output::Output(&local_20,InfoPrefix);
    pOVar6 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    pOVar6 = Output::operator<<(pOVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::Position_abi_cxx11_);
    pOVar6 = Output::operator<<(pOVar6,(char (*) [3])" {");
    pOVar6 = Output::operator<<(pOVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::StartPos_abi_cxx11_);
    pOVar6 = Output::operator<<(pOVar6,(char (*) [2])"|");
    pOVar6 = Output::operator<<(pOVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::Fen_abi_cxx11_);
    Output::operator<<(pOVar6,(char (*) [28])" <fen_string>} [<movelist>]");
    Output::~Output(&local_20);
    Output::Output((Output *)&position,InfoPrefix);
    Output::operator<<((Output *)&position,
                       (char (*) [52])"Set a new position and apply <movelist> (if given).");
    Output::~Output((Output *)&position);
    return;
  }
  uVar2 = (*this->engine->_vptr_ChessEngine[8])();
  if ((uVar2 & 1) == 0) {
    (*this->engine->_vptr_ChessEngine[7])();
    std::__cxx11::string::clear();
  }
  move = local_18;
  lVar4 = std::__cxx11::string::size();
  pcVar5 = local_18;
  if (lVar4 != 0) {
    __s2 = (char *)std::__cxx11::string::c_str();
    __n = std::__cxx11::string::size();
    iVar3 = strncmp(pcVar5,__s2,__n);
    if (iVar3 == 0) {
      lVar4 = std::__cxx11::string::size();
      local_18 = local_18 + lVar4;
      NextWord(&local_18);
      goto LAB_00149e59;
    }
  }
  bVar1 = ParamMatch((string *)token::StartPos_abi_cxx11_,&local_18);
  if (bVar1) {
    iVar3 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      return;
    }
  }
  else {
    ParamMatch((string *)token::Fen_abi_cxx11_,&local_18);
    iVar3 = (*this->engine->_vptr_ChessEngine[9])(this->engine,local_18);
    local_18 = (char *)CONCAT44(extraout_var_00,iVar3);
  }
LAB_00149e59:
  NextWord(&local_18);
  ParamMatch((string *)token::Moves_abi_cxx11_,&local_18);
  do {
    bVar1 = false;
    if (local_18 != (char *)0x0) {
      pcVar5 = NextWord(&local_18);
      bVar1 = *pcVar5 != '\0';
    }
    if (!bVar1) goto LAB_00149f45;
    local_48 = local_18;
    bVar1 = IsMove(local_18);
    if (!bVar1) goto LAB_00149f45;
    iVar3 = (*this->engine->_vptr_ChessEngine[10])(this->engine,local_18);
    local_18 = (char *)CONCAT44(extraout_var_01,iVar3);
  } while (local_18 != (char *)0x0);
  Output::Output(&local_50,InfoPrefix);
  pOVar6 = Output::operator<<(&local_50,(char (*) [15])"Invalid move: ");
  Output::operator<<(pOVar6,&local_48);
  Output::~Output(&local_50);
LAB_00149f45:
  if (local_18 == (char *)0x0) {
    local_c8 = "";
  }
  else {
    local_c8 = move;
  }
  std::__cxx11::string::operator=((string *)&this->lastPosition,local_c8);
  bVar1 = ChessEngine::IsDebugOn(this->engine);
  if (bVar1) {
    (*this->engine->_vptr_ChessEngine[0xc])();
  }
  return;
}

Assistant:

void UCIAdapter::PositionCommand(const char* params)
{
  if (!params || !*params || ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Position << " {" << token::StartPos << "|"
             << token::Fen << " <fen_string>} [<movelist>]";
    Output() << "Set a new position and apply <movelist> (if given).";
    return;
  }

  if (!engine->IsInitialized()) {
    engine->Initialize();
    lastPosition.clear();
  }

  const char* position = params;
  if (lastPosition.size() &&
      !strncmp(params, lastPosition.c_str(), lastPosition.size()))
  {
    NextWord(params += lastPosition.size());
  }
  else {
    if (ParamMatch(token::StartPos, params)) {
      if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
        return;
      }
    }
    else {
      ParamMatch(token::Fen, params);
      params = engine->SetPosition(params);
    }
  }

  // simply consume "moves" token if present
  NextWord(params);
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  lastPosition = params ? position : "";
  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}